

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O2

void duckdb_je_hpdata_purge_end(hpdata_t *hpdata,hpdata_purge_state_t *purge_state)

{
  fb_group_t *dst;
  size_t in_RCX;
  size_t in_RDX;
  
  dst = purge_state->to_purge;
  fb_bit_not(dst,dst,in_RDX);
  fb_bit_and(hpdata->touched_pages,hpdata->touched_pages,dst,in_RCX);
  hpdata->h_ntouched = hpdata->h_ntouched - purge_state->ndirty_to_purge;
  return;
}

Assistant:

void
hpdata_purge_end(hpdata_t *hpdata, hpdata_purge_state_t *purge_state) {
	assert(!hpdata_alloc_allowed_get(hpdata));
	hpdata_assert_consistent(hpdata);
	/* See the comment in reserve. */
	assert(!hpdata->h_in_psset || hpdata->h_updating);

	assert(purge_state->npurged == fb_scount(purge_state->to_purge,
	    HUGEPAGE_PAGES, 0, HUGEPAGE_PAGES));
	assert(purge_state->npurged >= purge_state->ndirty_to_purge);

	fb_bit_not(purge_state->to_purge, purge_state->to_purge,
	    HUGEPAGE_PAGES);
	fb_bit_and(hpdata->touched_pages, hpdata->touched_pages,
	    purge_state->to_purge, HUGEPAGE_PAGES);
	assert(hpdata->h_ntouched >= purge_state->ndirty_to_purge);
	hpdata->h_ntouched -= purge_state->ndirty_to_purge;

	hpdata_assert_consistent(hpdata);
}